

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binomial_heap.cpp
# Opt level: O2

BiHeap binomial_heap_union(BiHeap *h1,BiHeap *h2)

{
  int iVar1;
  _BinomialNode **pp_Var2;
  _Binomialheap _Var3;
  _BinomialNode **pp_Var4;
  _BinomialNode *p_Var5;
  BinomialNode *pBVar6;
  BinomialNode *pBVar7;
  
  pp_Var2 = &binomial_heap_make()->head;
  _Var3.head = binomial_heap_merge(*h1,*h2);
  *pp_Var2 = _Var3.head;
  free(*h1);
  *h1 = (BiHeap)0x0;
  free(*h2);
  *h2 = (BiHeap)0x0;
  if (_Var3.head == (BinomialNode *)0x0) {
    return (BiHeap)pp_Var2;
  }
  pBVar6 = (BinomialNode *)0x0;
  do {
    pBVar7 = _Var3.head;
    pp_Var4 = &pBVar6->sibling;
    if (pBVar6 == (BinomialNode *)0x0) {
      pp_Var4 = pp_Var2;
    }
    while( true ) {
      _Var3.head = pBVar7->sibling;
      if (_Var3.head == (_BinomialNode *)0x0) {
        return (BiHeap)pp_Var2;
      }
      iVar1 = pBVar7->degree;
      pBVar6 = pBVar7;
      if ((iVar1 != (_Var3.head)->degree) ||
         ((p_Var5 = (_Var3.head)->sibling, p_Var5 != (_BinomialNode *)0x0 &&
          (iVar1 == p_Var5->degree)))) break;
      if ((_Var3.head)->key < pBVar7->key) {
        *pp_Var4 = _Var3.head;
        p_Var5 = _Var3.head;
        _Var3.head = pBVar7;
      }
      else {
        pBVar7->sibling = p_Var5;
        p_Var5 = pBVar7;
      }
      (_Var3.head)->p = p_Var5;
      (_Var3.head)->sibling = p_Var5->child;
      p_Var5->child = _Var3.head;
      p_Var5->degree = iVar1 + 1;
    }
  } while( true );
}

Assistant:

BiHeap binomial_heap_union(BiHeap *h1, BiHeap *h2) {
    BiHeap h = binomial_heap_make();
//    firstly merge two heaps
    h->head = binomial_heap_merge(*h1, *h2);
    free(*h1);
    *h1 = NULL;
    free(*h2);
    *h2 = NULL;
//    if the result is empty, ignore next steps
    if (h->head == NULL) {
        return h;
    }

    BinomialNode *prev = NULL;
    BinomialNode *x = h->head;
    BinomialNode *next = x->sibling;

//  travelling the root list, and merge the adjacent heaps which have same degree.
    while (next != NULL) {
        if (x->degree != next->degree
            || (next->sibling != NULL
                && x->degree == next->sibling->degree)) {
            // case 3 or case 2, just move forward
            prev = x;
            x = next;
        } else if (x->key <= next->key) {
            // x->key <= next->key
            x->sibling = next->sibling;
            binomial_link(next, x);
        } else {
            // x->key > next->key
            if (prev == NULL) {
                h->head = next;
            } else {
                prev->sibling = next;
            }
            binomial_link(x, next);
        }
        // change the next
        next = x->sibling;
    }
    return h;
}